

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::AddLogSink(LogSink *destination)

{
  LogSink *destination_local;
  
  destination_local = destination;
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)sink_mutex_);
  if (sinks_ == (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
    sinks_ = (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)operator_new(0x18);
    (sinks_->super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (sinks_->super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (sinks_->super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::push_back
            (sinks_,&destination_local);
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)sink_mutex_);
  return;
}

Assistant:

inline void LogDestination::AddLogSink(LogSink *destination) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&sink_mutex_);
  if (!sinks_)  sinks_ = new vector<LogSink*>;
  sinks_->push_back(destination);
}